

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_auth_resp(Curl_easy *data,int smtpcode,smtpstate instate)

{
  saslprogress local_34;
  anon_union_280_10_9f9d5394_for_proto *paStack_30;
  saslprogress progress;
  smtp_conn *smtpc;
  connectdata *conn;
  smtpstate local_18;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  smtpc = (smtp_conn *)data->conn;
  paStack_30 = &((connectdata *)smtpc)->proto;
  local_18 = instate;
  result = smtpcode;
  _instate_local = data;
  conn._4_4_ = Curl_sasl_continue(&(((connectdata *)smtpc)->proto).imapc.sasl,data,smtpcode,
                                  &local_34);
  if (conn._4_4_ == CURLE_OK) {
    if (local_34 == SASL_IDLE) {
      Curl_failf(_instate_local,"Authentication cancelled");
      conn._4_4_ = CURLE_LOGIN_DENIED;
    }
    else if (local_34 == SASL_DONE) {
      smtp_state(_instate_local,SMTP_STOP);
    }
  }
  return conn._4_4_;
}

Assistant:

static CURLcode smtp_state_auth_resp(struct Curl_easy *data,
                                     int smtpcode,
                                     smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  saslprogress progress;

  (void)instate; /* no use for this yet */

  result = Curl_sasl_continue(&smtpc->sasl, data, smtpcode, &progress);
  if(!result)
    switch(progress) {
    case SASL_DONE:
      smtp_state(data, SMTP_STOP);  /* Authenticated */
      break;
    case SASL_IDLE:            /* No mechanism left after cancellation */
      failf(data, "Authentication cancelled");
      result = CURLE_LOGIN_DENIED;
      break;
    default:
      break;
    }

  return result;
}